

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void google::protobuf::descriptor_unittest::ExtractDebugString
               (FileDescriptor *file,
               flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *visited,vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *debug_strings)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  anon_union_8_1_a8a14541_for_iterator_2 aVar3;
  FileDescriptor *file_00;
  basic_string_view<char,_std::char_traits<char>_> *key;
  int index;
  string local_88;
  anon_union_8_1_a8a14541_for_iterator_2 local_68;
  pointer local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  pointer local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  flat_hash_set<std::basic_string_view<char,_std::char_traits<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_38;
  
  local_88._M_string_length = (size_type)(file->name_->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)file->name_->_M_string_length;
  local_38 = visited;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
  ::EmplaceDecomposable::operator()
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
              *)&local_68,&local_38,(basic_string_view<char,_std::char_traits<char>_> *)&local_88,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_88);
  if ((char)local_58 == '\x01') {
    if (0 < file->dependency_count_) {
      index = 0;
      do {
        file_00 = FileDescriptor::dependency(file,index);
        ExtractDebugString(file_00,visited,debug_strings);
        index = index + 1;
      } while (index < file->dependency_count_);
    }
    pcVar2 = (file->name_->_M_dataplus)._M_p;
    aVar3 = (anon_union_8_1_a8a14541_for_iterator_2)file->name_->_M_string_length;
    FileDescriptor::DebugString_abi_cxx11_(&local_88,file);
    paVar1 = &local_88.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p == paVar1) {
      local_48._8_8_ = local_88.field_2._8_8_;
      local_58 = &local_48;
    }
    else {
      local_58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_88._M_dataplus._M_p;
    }
    local_48._M_allocated_capacity._1_7_ = local_88.field_2._M_allocated_capacity._1_7_;
    local_48._M_local_buf[0] = local_88.field_2._M_local_buf[0];
    local_50 = (pointer)local_88._M_string_length;
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)paVar1;
    local_68 = aVar3;
    local_60 = pcVar2;
    std::
    vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>>
    ::
    emplace_back<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>
              ((vector<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>>>
                *)debug_strings,
               (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_68);
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar1) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void ExtractDebugString(
    const FileDescriptor* file, absl::flat_hash_set<absl::string_view>* visited,
    std::vector<std::pair<absl::string_view, std::string>>* debug_strings) {
  if (!visited->insert(file->name()).second) {
    return;
  }
  for (int i = 0; i < file->dependency_count(); ++i) {
    ExtractDebugString(file->dependency(i), visited, debug_strings);
  }
  debug_strings->push_back({file->name(), file->DebugString()});
}